

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::SetPathDependentInfo(GlobOpt *this,bool conditionToBranch,PathDependentInfo *info)

{
  Instr *pIVar1;
  code *pcVar2;
  GlobOpt *pGVar3;
  bool bVar4;
  BOOL BVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  BasicBlock *pBVar7;
  Type *ppFVar8;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  BasicBlock *pBVar9;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  Iterator local_48;
  GlobOpt *local_38;
  
  pBVar7 = this->currentBlock;
  pBVar9 = pBVar7;
  if ((pBVar7->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28a6,"(this->currentBlock->GetSuccList()->Count() == 2)",
                       "this->currentBlock->GetSuccList()->Count() == 2");
    if (!bVar4) goto LAB_00462b14;
    *puVar6 = 0;
    pBVar7 = this->currentBlock;
    pBVar9 = pBVar7;
  }
  do {
    pBVar7 = pBVar7->next;
    if (pBVar7 == (BasicBlock *)0x0) break;
  } while ((pBVar7->field_0x18 & 1) != 0);
  pIVar1 = pBVar7->firstInstr;
  pSVar10 = &(pBVar9->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.list = pSVar10;
  local_48.current = &pSVar10->super_SListNodeBase<Memory::ArenaAllocator>;
  local_38 = this;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if (pSVar10 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00462b14;
      *puVar6 = 0;
      pSVar10 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    }
    pGVar3 = local_38;
    pSVar10 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
              (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               &pSVar10->super_SListNodeBase<Memory::ArenaAllocator>)->
              super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar10 == local_48.list) break;
    local_48.current = (NodeBase *)pSVar10;
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    pSVar10 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    if (((*ppFVar8)->succBlock->firstInstr == pIVar1) != conditionToBranch) {
      FlowEdge::SetPathDependentInfo(*ppFVar8,info,local_38->alloc);
      return;
    }
  }
  BVar5 = Func::HasTry(local_38->func);
  if (BVar5 != 0) {
    return;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(pGVar3->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(pGVar3->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,FGPeepsPhase,sourceContextId,functionId);
  if (bVar4) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x28b3,
                     "(this->func->HasTry() || Js::Configuration::Global.flags.Off.IsEnabled(((Js::FGPeepsPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                     ,"this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func)");
  if (bVar4) {
    *puVar6 = 0;
    return;
  }
LAB_00462b14:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
GlobOpt::SetPathDependentInfo(const bool conditionToBranch, const PathDependentInfo &info)
{
    Assert(this->currentBlock->GetSuccList()->Count() == 2);
    IR::Instr * fallthrough = this->currentBlock->GetNext()->GetFirstInstr();
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->currentBlock->GetSuccList())
    {
        if (conditionToBranch == (edge->GetSucc()->GetFirstInstr() != fallthrough))
        {
            edge->SetPathDependentInfo(info, alloc);
            return;
        }
    }
    NEXT_SLISTBASECOUNTED_ENTRY;

    // In case flowgraph peeps is disabled, we could have conditional branch to next instr
    Assert(this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func));
}